

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interp.cc
# Opt level: O1

Result RunAllExports(Ptr *instance,Errors *errors)

{
  pointer pEVar1;
  ExternType *pEVar2;
  Result RVar3;
  ExportDesc *export_;
  pointer pEVar4;
  Enum EVar5;
  byte bVar6;
  string_view name;
  Ptr trap;
  RefPtr<wabt::interp::Func> func;
  RefPtr<wabt::interp::Module> module;
  Values results;
  Values params;
  undefined7 in_stack_ffffffffffffff30;
  Ptr local_c8;
  RefPtr<wabt::interp::Func> local_a8;
  RefPtr<wabt::interp::Module> local_88;
  Ptr *local_70;
  Values local_68;
  Values local_48;
  
  local_70 = instance;
  wabt::interp::RefPtr<wabt::interp::Module>::RefPtr
            (&local_88,&s_store,(Ref)(instance->obj_->module_).index);
  pEVar1 = ((local_88.obj_)->desc_).exports.
           super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  EVar5 = Ok;
  for (pEVar4 = ((local_88.obj_)->desc_).exports.
                super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar4 != pEVar1; pEVar4 = pEVar4 + 1) {
    pEVar2 = (pEVar4->type).type._M_t.
             super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
             .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
    if ((pEVar2->kind == First) && (pEVar2[1]._vptr_ExternType == *(_func_int ***)&pEVar2[1].kind))
    {
      if (s_trace_stream != (Stream *)0x0) {
        wabt::Stream::Writef
                  (s_trace_stream,">>> running export \"%s\":\n",
                   (pEVar4->type).name._M_dataplus._M_p);
      }
      wabt::interp::RefPtr<wabt::interp::Func>::RefPtr
                (&local_a8,&s_store,
                 (Ref)(local_70->obj_->funcs_).
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start[pEVar4->index].index);
      local_48.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.root_index_ = 0;
      local_c8.obj_ = (Trap *)0x0;
      local_c8.store_ = (Store *)0x0;
      RVar3 = wabt::interp::Func::Call
                        (local_a8.obj_,&s_store,&local_48,&local_68,&local_c8,s_trace_stream);
      bVar6 = RVar3.enum_ == Error;
      name.size_ = (size_type)pEVar2;
      name.data_ = (char *)(pEVar4->type).name._M_string_length;
      wabt::interp::WriteCall
                ((interp *)
                 s_stdout_stream._M_t.
                 super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
                 super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl,
                 (Stream *)(pEVar4->type).name._M_dataplus._M_p,name,(FuncType *)&local_48,&local_68
                 ,(Values *)&local_c8,(Ptr *)CONCAT17(bVar6,in_stack_ffffffffffffff30));
      if (local_c8.obj_ != (Trap *)0x0) {
        wabt::interp::Store::DeleteRoot(local_c8.store_,local_c8.root_index_);
        local_c8.obj_ = (Trap *)0x0;
        local_c8.store_ = (Store *)0x0;
        local_c8.root_index_ = 0;
      }
      if (local_68.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.
                        super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_48.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a8.obj_ != (Func *)0x0) {
        wabt::interp::Store::DeleteRoot(local_a8.store_,local_a8.root_index_);
        local_a8.obj_ = (Func *)0x0;
        local_a8.store_ = (Store *)0x0;
        local_a8.root_index_ = 0;
      }
      EVar5 = (Enum)(EVar5 == Error | bVar6);
    }
  }
  if (local_88.obj_ != (Module *)0x0) {
    wabt::interp::Store::DeleteRoot(local_88.store_,local_88.root_index_);
  }
  return (Result)EVar5;
}

Assistant:

Result RunAllExports(const Instance::Ptr& instance, Errors* errors) {
  Result result = Result::Ok;

  auto module = s_store.UnsafeGet<Module>(instance->module());
  auto&& module_desc = module->desc();

  for (auto&& export_ : module_desc.exports) {
    if (export_.type.type->kind != ExternalKind::Func) {
      continue;
    }
    auto* func_type = cast<FuncType>(export_.type.type.get());
    if (func_type->params.empty()) {
      if (s_trace_stream) {
        s_trace_stream->Writef(">>> running export \"%s\":\n",
                               export_.type.name.c_str());
      }
      auto func = s_store.UnsafeGet<Func>(instance->funcs()[export_.index]);
      Values params;
      Values results;
      Trap::Ptr trap;
      result |= func->Call(s_store, params, results, &trap, s_trace_stream);
      WriteCall(s_stdout_stream.get(), export_.type.name, *func_type, params,
                results, trap);
    }
  }

  return result;
}